

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::RenderBuffer::exec(RenderBuffer *this,Thread *t)

{
  code *pcVar1;
  deUint32 dVar2;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Program *pPVar5;
  Buffer *pBVar6;
  MessageBuilder local_22a0;
  MessageBuilder local_2110;
  MessageBuilder local_1f80;
  MessageBuilder local_1df0;
  MessageBuilder local_1c60;
  MessageBuilder local_1ad0;
  MessageBuilder local_1940;
  long local_17b0;
  MessageBuilder local_17a8;
  MessageBuilder local_1618;
  MessageBuilder local_1488;
  MessageBuilder local_12f8;
  MessageBuilder local_1168;
  MessageBuilder local_fd8;
  MessageBuilder local_e48;
  MessageBuilder local_cb8;
  int local_b24;
  undefined1 local_b20 [4];
  GLint posLoc;
  MessageBuilder local_990;
  MessageBuilder local_800;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  RenderBuffer *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [46])"Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1c0))
              (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x698);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [22])"End -- glClearColor()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4e0,(char (*) [38])"Begin -- glClear(GL_COLOR_BUFFER_BIT)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x188))(0x4000);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x69c);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_670,(char (*) [17])"End -- glClear()")
  ;
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
  tcu::ThreadUtil::Thread::newMessage(&local_800,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_800,(char (*) [23])"Begin -- glUseProgram(");
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_800);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1680);
    pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
    (*pcVar1)(pPVar5->program);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(m_program->program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6a0);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_990,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_990,(char (*) [22])"End -- glUseProgram()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_990);
  tcu::ThreadUtil::Thread::newMessage((MessageBuilder *)local_b20,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     ((MessageBuilder *)local_b20,(char (*) [30])"Begin -- glGetAttribLocation(");
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [11])", \"a_pos\")");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b20);
  pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x780);
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  local_b24 = (*pcVar1)(pPVar5->program,"a_pos");
  dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
  glu::checkError(dVar2,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                  ,0x6a5);
  tcu::ThreadUtil::Thread::newMessage(&local_cb8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_cb8,(char (*) [8])"End -- ");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_b24);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar4,(char (*) [25])" = glGetAttribLocation()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_cb8);
  tcu::ThreadUtil::Thread::newMessage(&local_e48,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_e48,(char (*) [36])"Begin -- glEnableVertexAttribArray(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_b24);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_e48);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x610))(local_b24);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"enableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6a9);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_fd8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_fd8,(char (*) [35])"End -- glEnableVertexAttribArray()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_fd8);
  tcu::ThreadUtil::Thread::newMessage(&local_1168,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1168,(char (*) [40])"Begin -- glBindBuffer(GL_ARRAY_BUFFER, ");
  pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pBVar6->buffer);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1168);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x40);
    pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
    (*pcVar1)(0x8892,pBVar6->buffer);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, m_buffer->buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6ad);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_12f8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_12f8,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_12f8);
  tcu::ThreadUtil::Thread::newMessage(&local_1488,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1488,(char (*) [32])"Begin -- glVertexAttribPointer(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_b24);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [26])0x57ebf4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1488);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x19f0))(local_b24,2,0x1400,1,0,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"vertexAttribPointer(posLoc, 2, GL_BYTE, GL_TRUE, 0, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b1);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1618,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1618,(char (*) [31])"End -- glVertexAttribPointer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1618);
  tcu::ThreadUtil::Thread::newMessage(&local_17a8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_17a8,(char (*) [40])"Begin -- glDrawArrays(GL_TRIANGLES, 0, ");
  pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  local_17b0 = pBVar6->size / 2;
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_17b0);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_17a8);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x538);
    pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
    (*pcVar1)(4,0,(long)((ulong)(uint)((int)pBVar6->size >> 0x1f) << 0x20 |
                        pBVar6->size & 0xffffffffU) / 2 & 0xffffffff);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"drawArrays(GL_TRIANGLES, 0, (GLsizei)m_buffer->size / 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b5);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1940,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1940,(char (*) [22])"End -- glDrawArrays()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1940);
  tcu::ThreadUtil::Thread::newMessage(&local_1ad0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1ad0,(char (*) [42])"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1ad0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6b9);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1c60,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c60,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c60);
  tcu::ThreadUtil::Thread::newMessage(&local_1df0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1df0,(char (*) [37])"Begin -- glDisableVertexAttribArray(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_b24);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1df0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x518))(local_b24);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"disableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6bd);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1f80,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1f80,(char (*) [36])"End -- glDisableVertexAttribArray()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1f80);
  tcu::ThreadUtil::Thread::newMessage(&local_2110,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2110,(char (*) [25])"Begin -- glUseProgram(0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2110);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1680))(0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6c1);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_22a0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_22a0,(char (*) [22])"End -- glUseProgram()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_22a0);
  return;
}

Assistant:

void RenderBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clearColor(0.5f, 0.5f, 0.5f, 1.0f));
	thread.newMessage() << "End -- glClearColor()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glClear(GL_COLOR_BUFFER_BIT)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clear(GL_COLOR_BUFFER_BIT));
	thread.newMessage() << "End -- glClear()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(" << m_program->program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(m_program->program));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glGetAttribLocation(" << m_program->program << ", \"a_pos\")" << tcu::ThreadUtil::Message::End;
	GLint posLoc = thread.gl.getAttribLocation(m_program->program, "a_pos");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetAttribLocation()");
	thread.newMessage() << "End -- " << posLoc << " = glGetAttribLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEnableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, enableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glEnableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, " << m_buffer->buffer << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, m_buffer->buffer));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glVertexAttribPointer(" << posLoc << ", GL_BYTE, GL_TRUE, 0, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, vertexAttribPointer(posLoc, 2, GL_BYTE, GL_TRUE, 0, 0));
	thread.newMessage() << "End -- glVertexAttribPointer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDrawArrays(GL_TRIANGLES, 0, " << (m_buffer->size / 2) << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, drawArrays(GL_TRIANGLES, 0, (GLsizei)m_buffer->size / 2));
	thread.newMessage() << "End -- glDrawArrays()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDisableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, disableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glDisableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(0));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;
}